

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageForName(Context *this,string *name,bool isDebug)

{
  element_type *peVar1;
  mapped_type *pmVar2;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<pstack::Elf::Object> sVar4;
  MmapReader *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  shared_ptr<pstack::Elf::Object> res;
  bool isDebug_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  sVar4 = getImageIfLoaded((Context *)local_40,name);
  peVar1 = res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3 = sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_40 == (undefined1  [8])0x0) {
    local_50 = (MmapReader *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstack::MmapReader,std::allocator<pstack::MmapReader>,pstack::Context&,std::__cxx11::string_const&>
              (&local_48,&local_50,
               (allocator<pstack::MmapReader> *)
               ((long)&res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 6),(Context *)name,
               (key_type *)CONCAT71(in_register_00000011,isDebug));
    std::__shared_ptr<pstack::MmapReader,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pstack::MmapReader,pstack::MmapReader>
              ((__shared_ptr<pstack::MmapReader,(__gnu_cxx::_Lock_policy)2> *)&local_50,local_50);
    std::__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<pstack::Elf::Object>,pstack::Context&,std::shared_ptr<pstack::MmapReader>,bool&>
              ((__shared_ptr<pstack::Elf::Object,(__gnu_cxx::_Lock_policy)2> *)this,
               (allocator<pstack::Elf::Object> *)
               ((long)&res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 6),(Context *)name,
               (shared_ptr<pstack::MmapReader> *)&local_50,
               (bool *)((long)&res.
                               super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                           *)&name[1].field_2,(key_type *)CONCAT71(in_register_00000011,isDebug));
    (pmVar2->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)&(this->dwarfCache)._M_t._M_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar2->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    *(undefined1 (*) [8])&(this->dwarfCache)._M_t._M_impl = local_40;
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    *(element_type **)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = peVar1;
    local_40 = (undefined1  [8])0x0;
  }
  if (res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageForName(const std::string &name, bool isDebug) {
    auto res = getImageIfLoaded(name);
    if (res != nullptr)
        return res;
    auto item = std::make_shared<Elf::Object>(*this, std::make_shared<MmapReader>(*this, name), isDebug);
    // don't cache negative entries: assign into the cache after we've constructed:
    // a failure to load the image will throw.
    elfCache[name] = item;
    return item;
}